

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_object.cc
# Opt level: O0

void ASN1_OBJECT_free(ASN1_OBJECT *a)

{
  ASN1_OBJECT *a_local;
  
  if (a != (ASN1_OBJECT *)0x0) {
    if ((a->flags & 4U) != 0) {
      OPENSSL_free(a->sn);
      OPENSSL_free(a->ln);
      a->ln = (char **)0x0;
      a->sn = (char *)0x0;
    }
    if ((a->flags & 8U) != 0) {
      OPENSSL_free(a->data);
      a->data = (uchar *)0x0;
      a->length = 0;
    }
    if ((a->flags & 1U) != 0) {
      OPENSSL_free(a);
    }
  }
  return;
}

Assistant:

void ASN1_OBJECT_free(ASN1_OBJECT *a) {
  if (a == NULL) {
    return;
  }
  if (a->flags & ASN1_OBJECT_FLAG_DYNAMIC_STRINGS) {
    OPENSSL_free((void *)a->sn);
    OPENSSL_free((void *)a->ln);
    a->sn = a->ln = NULL;
  }
  if (a->flags & ASN1_OBJECT_FLAG_DYNAMIC_DATA) {
    OPENSSL_free((void *)a->data);
    a->data = NULL;
    a->length = 0;
  }
  if (a->flags & ASN1_OBJECT_FLAG_DYNAMIC) {
    OPENSSL_free(a);
  }
}